

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::init(Texture3DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  RenderTarget *pRVar4;
  Texture3D *this_00;
  NotSupportedError *this_01;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint depth;
  ulong uVar8;
  RGBA local_c4;
  ulong local_c0;
  string local_b8;
  TextureFormat local_98;
  tcu local_90 [16];
  Vector<float,_4> local_80;
  TextureFormatInfo fmtInfo;
  
  local_98 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&local_98);
  uVar5 = this->m_width;
  uVar3 = this->m_height;
  uVar2 = uVar3;
  if ((int)uVar3 < (int)uVar5) {
    uVar2 = uVar5;
  }
  depth = this->m_depth;
  if ((int)uVar2 <= (int)depth) {
    uVar2 = depth;
  }
  if (uVar2 == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0 < pRVar4->m_numSamples) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "Projected lookup validation not supported in multisample config",
                 (allocator<char> *)local_90);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_b8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar5 = this->m_width;
    uVar3 = this->m_height;
    depth = this->m_depth;
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar5,
             uVar3,depth);
  this->m_texture = this_00;
  local_c0 = (ulong)(0x20 - uVar7);
  lVar6 = 0;
  for (uVar8 = 0; local_c0 != uVar8; uVar8 = uVar8 + 1) {
    uVar3 = (int)(0xff / (long)(int)(0x1f - uVar7)) * (int)uVar8;
    uVar5 = 0xff;
    if (uVar3 < 0xff) {
      uVar5 = uVar3;
    }
    uVar5 = uVar5 * 0x101 ^ 0xffffff00;
    if ((int)uVar3 < 0) {
      uVar5 = 0xffffff00;
    }
    tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,(int)uVar8);
    pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_c4.m_value = uVar5;
    tcu::RGBA::toVec(&local_c4);
    tcu::operator*(local_90,&local_80,&fmtInfo.lookupScale);
    tcu::operator+((tcu *)&local_b8,(Vector<float,_4> *)local_90,&fmtInfo.lookupBias);
    tcu::clear((PixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),
               (Vec4 *)&local_b8);
    lVar6 = lVar6 + 0x28;
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DMipmapCase::init (void)
{
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(m_internalFormat);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth))+1;

	if (m_coordType == COORDTYPE_PROJECTED && m_context.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (0xff << 16) | (dec << 8) | inc;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}